

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_reader_init_mem(mz_zip_archive *pZip,void *pMem,size_t size,mz_uint flags)

{
  mz_bool mVar1;
  mz_uint flags_local;
  size_t size_local;
  void *pMem_local;
  mz_zip_archive *pZip_local;
  
  if (pMem == (void *)0x0) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    }
    pZip_local._0_4_ = 0;
  }
  else if (size < 0x16) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_NOT_AN_ARCHIVE;
    }
    pZip_local._0_4_ = 0;
  }
  else {
    mVar1 = mz_zip_reader_init_internal(pZip,flags);
    if (mVar1 == 0) {
      pZip_local._0_4_ = 0;
    }
    else {
      pZip->m_zip_type = MZ_ZIP_TYPE_MEMORY;
      pZip->m_archive_size = size;
      pZip->m_pRead = mz_zip_mem_read_func;
      pZip->m_pIO_opaque = pZip;
      pZip->m_pNeeds_keepalive = (mz_file_needs_keepalive)0x0;
      pZip->m_pState->m_pMem = pMem;
      pZip->m_pState->m_mem_size = size;
      mVar1 = mz_zip_reader_read_central_dir(pZip,flags);
      if (mVar1 == 0) {
        mz_zip_reader_end_internal(pZip,0);
        pZip_local._0_4_ = 0;
      }
      else {
        pZip_local._0_4_ = 1;
      }
    }
  }
  return (mz_bool)pZip_local;
}

Assistant:

mz_bool mz_zip_reader_init_mem(mz_zip_archive *pZip, const void *pMem,
                               size_t size, mz_uint flags) {
  if (!pMem)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

  if (size < MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
    return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

  if (!mz_zip_reader_init_internal(pZip, flags))
    return MZ_FALSE;

  pZip->m_zip_type = MZ_ZIP_TYPE_MEMORY;
  pZip->m_archive_size = size;
  pZip->m_pRead = mz_zip_mem_read_func;
  pZip->m_pIO_opaque = pZip;
  pZip->m_pNeeds_keepalive = NULL;

#ifdef __cplusplus
  pZip->m_pState->m_pMem = const_cast<void *>(pMem);
#else
  pZip->m_pState->m_pMem = (void *)pMem;
#endif

  pZip->m_pState->m_mem_size = size;

  if (!mz_zip_reader_read_central_dir(pZip, flags)) {
    mz_zip_reader_end_internal(pZip, MZ_FALSE);
    return MZ_FALSE;
  }

  return MZ_TRUE;
}